

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLValidator.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::XMLValidator::emitError
          (XMLValidator *this,Codes toEmit,char *text1,char *text2,char *text3,char *text4)

{
  int *piVar1;
  XMLErrorReporter *pXVar2;
  ErrTypes EVar3;
  XMLScanner *pXVar4;
  Codes *pCVar5;
  LastExtEntityInfo lastInfo;
  XMLCh errText [2048];
  
  EVar3 = XMLValid::errorType(toEmit);
  if (EVar3 != ErrType_Warning) {
    piVar1 = &this->fScanner->fErrorCount;
    *piVar1 = *piVar1 + 1;
  }
  if (this->fErrorReporter != (XMLErrorReporter *)0x0) {
    (**(code **)(*sMsgLoader + 0x20))
              (sMsgLoader,toEmit,errText,0x7ff,text1,text2,text3,text4,
               this->fScanner->fMemoryManager);
    ReaderMgr::getLastExtEntityInfo(this->fReaderMgr,&lastInfo);
    pXVar2 = this->fErrorReporter;
    EVar3 = XMLValid::errorType(toEmit);
    (*pXVar2->_vptr_XMLErrorReporter[2])
              (pXVar2,toEmit,XMLUni::fgValidityDomain,(ulong)EVar3,errText,lastInfo.systemId,
               CONCAT44(lastInfo.publicId._4_4_,lastInfo.publicId._0_4_),
               CONCAT44(lastInfo.lineNumber._4_4_,(undefined4)lastInfo.lineNumber),
               lastInfo.colNumber);
  }
  if (toEmit - E_LowBounds < 0x4f) {
    pXVar4 = this->fScanner;
    if (pXVar4->fValidationConstraintFatal == false) {
      return;
    }
  }
  else {
    if ((toEmit & ~E_LowBounds) != F_LowBounds) {
      return;
    }
    pXVar4 = this->fScanner;
  }
  if ((pXVar4->fExitOnFirstFatal == true) && (pXVar4->fInException == false)) {
    pCVar5 = (Codes *)__cxa_allocate_exception(4);
    *pCVar5 = toEmit;
    __cxa_throw(pCVar5,&XMLValid::Codes::typeinfo,0);
  }
  return;
}

Assistant:

void XMLValidator::emitError(const  XMLValid::Codes toEmit
                            , const char* const     text1
                            , const char* const     text2
                            , const char* const     text3
                            , const char* const     text4)
{
    // Bump the error count if it is not a warning
    if (XMLValid::errorType(toEmit) != XMLErrorReporter::ErrType_Warning)
        fScanner->incrementErrorCount();

    //	Call error reporter if we have one
    if (fErrorReporter)
    {
        //
        //  Load the message into alocal and replace any tokens found in
        //  the text.
        //
        const XMLSize_t maxChars = 2047;
        XMLCh errText[maxChars + 1];

        // load the text
        if (!sMsgLoader->loadMsg(toEmit, errText, maxChars, text1, text2, text3, text4, fScanner->getMemoryManager()))
        {
          // <TBD> Should probably load a default message here
        }

        //
        //  Create a LastExtEntityInfo structure and get the reader manager
        //  to fill it in for us. This will give us the information about
        //  the last reader on the stack that was an external entity of some
        //  sort (i.e. it will ignore internal entities.
        //
        ReaderMgr::LastExtEntityInfo lastInfo;
        fReaderMgr->getLastExtEntityInfo(lastInfo);

        fErrorReporter->error
        (
            toEmit
            , XMLUni::fgValidityDomain
            , XMLValid::errorType(toEmit)
            , errText
            , lastInfo.systemId
            , lastInfo.publicId
            , lastInfo.lineNumber
            , lastInfo.colNumber
        );
    }

    // Bail out if its fatal an we are to give up on the first fatal error
    if (((XMLValid::isError(toEmit) && fScanner->getValidationConstraintFatal())
         || XMLValid::isFatal(toEmit))
    &&  fScanner->getExitOnFirstFatal()
    &&  !fScanner->getInException())
    {
        throw toEmit;
    }
}